

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

FunctionData * __thiscall
inja::FunctionStorage::get(FunctionStorage *this,string_view name,uint num_args)

{
  FunctionData *i;
  const_iterator cVar1;
  FunctionData *pFVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  const_pointer local_28;
  size_type local_20;
  
  local_20 = name.size_;
  local_28 = name.data_;
  nonstd::sv_lite::basic_string_view::operator_cast_to_string
            (&bStack_48,(basic_string_view *)&local_28);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>_>_>
                  *)this,&bStack_48);
  std::__cxx11::string::~string((string *)&bStack_48);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->m_map)._M_t._M_impl.super__Rb_tree_header) {
    for (pFVar2 = *(FunctionData **)(cVar1._M_node + 2);
        pFVar2 != (FunctionData *)cVar1._M_node[2]._M_parent; pFVar2 = pFVar2 + 1) {
      if (pFVar2->num_args == num_args) {
        return pFVar2;
      }
    }
  }
  return (FunctionData *)0x0;
}

Assistant:

const FunctionData* get(nonstd::string_view name, unsigned int num_args) const {
		auto it = m_map.find(static_cast<std::string>(name));
		if (it == m_map.end()) return nullptr;
		for (auto&& i : it->second) {
			if (i.num_args == num_args) return &i;
		}
		return nullptr;
	}